

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSreadRanges<double>
               (MPSInput *mps,LPRowSetBase<double> *rset,NameSet *rnames,SPxOut *spxout)

{
  double dVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  char *pcVar5;
  double *pdVar6;
  SPxOut *in_RCX;
  MPSInput *in_RDI;
  double dVar7;
  Real RVar8;
  Verbosity old_verbosity;
  double val;
  int idx;
  char rngname [256];
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  MPSInput *in_stack_fffffffffffffdf0;
  NameSet *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  MPSInput *in_stack_fffffffffffffe10;
  MPSInput *in_stack_fffffffffffffe88;
  char local_128 [264];
  SPxOut *local_20;
  MPSInput *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  memset(local_128,0,0x100);
LAB_001b192b:
  do {
    do {
      do {
        bVar2 = MPSInput::readLine(in_stack_fffffffffffffe88);
        if (!bVar2) {
LAB_001b213d:
          MPSInput::syntaxError(in_stack_fffffffffffffdf0);
          return;
        }
        pcVar5 = MPSInput::field0(local_8);
        if (pcVar5 != (char *)0x0) {
          if ((local_20 != (SPxOut *)0x0) &&
             (VVar3 = SPxOut::getVerbosity(local_20), 3 < (int)VVar3)) {
            SPxOut::getVerbosity(local_20);
            (*local_20->_vptr_SPxOut[2])(local_20,&stack0xfffffffffffffec0);
            operator<<((SPxOut *)in_stack_fffffffffffffdf0,
                       (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            operator<<((SPxOut *)in_stack_fffffffffffffdf0,
                       (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            operator<<((SPxOut *)in_stack_fffffffffffffdf0,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            (*local_20->_vptr_SPxOut[2])(local_20,&stack0xfffffffffffffec4);
          }
          pcVar5 = MPSInput::field0(local_8);
          iVar4 = strcmp(pcVar5,"BOUNDS");
          if (iVar4 == 0) {
            MPSInput::setSection(local_8,BOUNDS);
            return;
          }
          pcVar5 = MPSInput::field0(local_8);
          iVar4 = strcmp(pcVar5,"ENDATA");
          if (iVar4 == 0) {
            MPSInput::setSection(local_8,ENDATA);
            return;
          }
          goto LAB_001b213d;
        }
        pcVar5 = MPSInput::field2(local_8);
        if (((pcVar5 != (char *)0x0) && (pcVar5 = MPSInput::field3(local_8), pcVar5 == (char *)0x0))
           || ((pcVar5 = MPSInput::field4(local_8), pcVar5 != (char *)0x0 &&
               (pcVar5 = MPSInput::field5(local_8), pcVar5 == (char *)0x0)))) {
          MPSInput::insertName(local_8,"_RNG_",false);
        }
        pcVar5 = MPSInput::field1(local_8);
        if (((pcVar5 == (char *)0x0) || (pcVar5 = MPSInput::field2(local_8), pcVar5 == (char *)0x0))
           || (pcVar5 = MPSInput::field3(local_8), pcVar5 == (char *)0x0)) goto LAB_001b213d;
        if (local_128[0] == '\0') {
          pcVar5 = MPSInput::field1(local_8);
          spxSnprintf(local_128,0x100,"%s",pcVar5);
        }
        pcVar5 = MPSInput::field1(local_8);
        iVar4 = strcmp(local_128,pcVar5);
      } while (iVar4 != 0);
      MPSInput::field2(local_8);
      iVar4 = NameSet::number(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
      if (iVar4 < 0) {
        MPSInput::field1(local_8);
        MPSInput::field2(local_8);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                   (char *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
      }
      else {
        pcVar5 = MPSInput::field3(local_8);
        dVar7 = atof(pcVar5);
        pdVar6 = LPRowSetBase<double>::lhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        dVar1 = *pdVar6;
        pdVar6 = (double *)infinity();
        if (-*pdVar6 < dVar1) {
          pdVar6 = LPRowSetBase<double>::rhs_w
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffdec);
          in_stack_fffffffffffffe88 = (MPSInput *)*pdVar6;
          pdVar6 = (double *)infinity();
          if ((double)in_stack_fffffffffffffe88 < *pdVar6) {
            if (dVar7 < 0.0) {
              pdVar6 = LPRowSetBase<double>::lhs_w
                                 ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                                  in_stack_fffffffffffffdec);
              *pdVar6 = dVar7 + *pdVar6;
            }
            else {
              pdVar6 = LPRowSetBase<double>::rhs_w
                                 ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                                  in_stack_fffffffffffffdec);
              *pdVar6 = dVar7 + *pdVar6;
            }
            goto LAB_001b1e75;
          }
        }
        pdVar6 = LPRowSetBase<double>::lhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        dVar1 = *pdVar6;
        pdVar6 = (double *)infinity();
        if (dVar1 <= -*pdVar6) {
          pdVar6 = LPRowSetBase<double>::rhs
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffdec);
          dVar1 = *pdVar6;
          RVar8 = spxAbs<double>(dVar7);
          pdVar6 = LPRowSetBase<double>::lhs_w
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffdec);
          *pdVar6 = dVar1 - RVar8;
        }
        else {
          pdVar6 = LPRowSetBase<double>::lhs
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffdec);
          dVar1 = *pdVar6;
          RVar8 = spxAbs<double>(dVar7);
          pdVar6 = LPRowSetBase<double>::rhs_w
                             ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffdec);
          *pdVar6 = dVar1 + RVar8;
        }
      }
LAB_001b1e75:
      pcVar5 = MPSInput::field5(local_8);
    } while (pcVar5 == (char *)0x0);
    MPSInput::field4(local_8);
    iVar4 = NameSet::number(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    if (-1 < iVar4) {
      pcVar5 = MPSInput::field5(local_8);
      dVar7 = atof(pcVar5);
      pdVar6 = LPRowSetBase<double>::lhs
                         ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                          in_stack_fffffffffffffdec);
      dVar1 = *pdVar6;
      pdVar6 = (double *)infinity();
      if (-*pdVar6 < dVar1) {
        pdVar6 = LPRowSetBase<double>::rhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        dVar1 = *pdVar6;
        pdVar6 = (double *)infinity();
        if (dVar1 < *pdVar6) {
          if (dVar7 < 0.0) {
            pdVar6 = LPRowSetBase<double>::lhs_w
                               ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                                in_stack_fffffffffffffdec);
            *pdVar6 = dVar7 + *pdVar6;
          }
          else {
            pdVar6 = LPRowSetBase<double>::rhs_w
                               ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                                in_stack_fffffffffffffdec);
            *pdVar6 = dVar7 + *pdVar6;
          }
          goto LAB_001b192b;
        }
      }
      pdVar6 = LPRowSetBase<double>::lhs
                         ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                          in_stack_fffffffffffffdec);
      in_stack_fffffffffffffe10 = (MPSInput *)*pdVar6;
      pdVar6 = (double *)infinity();
      if ((double)in_stack_fffffffffffffe10 <= -*pdVar6) {
        pdVar6 = LPRowSetBase<double>::rhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        in_stack_fffffffffffffdf0 = (MPSInput *)*pdVar6;
        RVar8 = spxAbs<double>(dVar7);
        in_stack_fffffffffffffdf8 = (NameSet *)((double)in_stack_fffffffffffffdf0 - RVar8);
        pdVar6 = LPRowSetBase<double>::lhs_w
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        *pdVar6 = (double)in_stack_fffffffffffffdf8;
      }
      else {
        pdVar6 = LPRowSetBase<double>::lhs
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        in_stack_fffffffffffffe00 = (char *)*pdVar6;
        RVar8 = spxAbs<double>(dVar7);
        in_stack_fffffffffffffe08 = (char *)((double)in_stack_fffffffffffffe00 + RVar8);
        pdVar6 = LPRowSetBase<double>::rhs_w
                           ((LPRowSetBase<double> *)in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdec);
        *pdVar6 = (double)in_stack_fffffffffffffe08;
      }
      goto LAB_001b192b;
    }
    MPSInput::field1(local_8);
    MPSInput::field4(local_8);
    MPSInput::entryIgnored
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (char *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  } while( true );
}

Assistant:

static void MPSreadRanges(MPSInput& mps,  LPRowSetBase<R>& rset, const NameSet& rnames,
                          SPxOut* spxout)
{
   char rngname[MPSInput::MAX_LINE_LEN] = { '\0' };
   int idx;
   R val;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD04 Range name     : " << rngname << std::endl;);

         if(!strcmp(mps.field0(), "BOUNDS"))
            mps.setSection(MPSInput::BOUNDS);
         else if(!strcmp(mps.field0(), "ENDATA"))
            mps.setSection(MPSInput::ENDATA);
         else
            break;

         return;
      }

      if(((mps.field2() != nullptr) && (mps.field3() == nullptr)) || ((mps.field4() != nullptr)
            && (mps.field5() == nullptr)))
         mps.insertName("_RNG_");

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      if(*rngname == '\0')
      {
         assert(strlen(mps.field1()) < MPSInput::MAX_LINE_LEN);
         spxSnprintf(rngname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());
      }

      /* The rules are:
       * Row Sign   LHS             RHS
       * ----------------------------------------
       *  G   +/-   rhs             rhs + |range|
       *  L   +/-   rhs - |range|   rhs
       *  E   +     rhs             rhs + range
       *  E   -     rhs + range     rhs
       * ----------------------------------------
       */
      if(!strcmp(rngname, mps.field1()))
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("Range", mps.field1(), "row", mps.field2());
         else
         {
            val = atof(mps.field3());

            // EQ
            if((rset.lhs(idx) > R(-infinity)) && (rset.rhs_w(idx) <  R(infinity)))
            {
               assert(rset.lhs(idx) == rset.rhs(idx));

               if(val >= 0)
                  rset.rhs_w(idx) += val;
               else
                  rset.lhs_w(idx) += val;
            }
            else
            {
               // GE
               if(rset.lhs(idx) > R(-infinity))
                  rset.rhs_w(idx)  = rset.lhs(idx) + spxAbs(val);
               // LE
               else
                  rset.lhs_w(idx)  = rset.rhs(idx) - spxAbs(val);
            }
         }

         if(mps.field5() != nullptr)
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("Range", mps.field1(), "row", mps.field4());
            else
            {
               val = atof(mps.field5());

               // EQ
               if((rset.lhs(idx) > R(-infinity)) && (rset.rhs(idx) <  R(infinity)))
               {
                  assert(rset.lhs(idx) == rset.rhs(idx));

                  if(val >= 0)
                     rset.rhs_w(idx) += val;
                  else
                     rset.lhs_w(idx) += val;
               }
               else
               {
                  // GE
                  if(rset.lhs(idx) > R(-infinity))
                     rset.rhs_w(idx)  = rset.lhs(idx) + spxAbs(val);
                  // LE
                  else
                     rset.lhs_w(idx)  = rset.rhs(idx) - spxAbs(val);
               }
            }
         }
      }
   }

   mps.syntaxError();
}